

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall CClient::ProcessServerPacket(CClient *this,CNetChunk *pPacket)

{
  CUnpacker *pCVar1;
  CSnapshot *pSnapshot;
  CSnapshotStorage CVar2;
  char cVar3;
  void *pvVar4;
  IGameClient *pIVar5;
  _func_int *p_Var6;
  IMapChecker *pIVar7;
  IOHANDLE pIVar8;
  IStorage *pIVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  undefined1 *puVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  char *pcVar24;
  SHA256_DIGEST *pSVar25;
  uchar *puVar26;
  char *pcVar27;
  undefined4 extraout_var;
  SHA256_DIGEST *pSVar28;
  _func_int **pp_Var29;
  int64 iVar30;
  long lVar31;
  undefined4 extraout_var_00;
  CData *pDst_;
  long lVar32;
  int64 iVar33;
  int64 iVar34;
  int64 iVar35;
  undefined1 *puVar36;
  uint uVar37;
  char *pcVar38;
  undefined8 uVar39;
  CClient *this_00;
  IConsole *pIVar40;
  int in_R9D;
  long in_FS_OFFSET;
  undefined1 auVar41 [16];
  CSnapshot *pDeltaShot;
  CUnpacker Unpacker;
  char aBuf_2 [256];
  char aBuf [256];
  CMsgPacker Msg;
  
  puVar17 = &stack0xffffffffffffffd0;
  do {
    puVar36 = puVar17;
    *(undefined8 *)(puVar36 + -0x1000) = 0;
    puVar17 = puVar36 + -0x1000;
  } while (puVar36 + -0x1000 != aBuf + 8);
  *(undefined8 *)(puVar36 + 0x1eff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pvVar4 = pPacket->m_pData;
  iVar20 = pPacket->m_DataSize;
  *(undefined8 *)(puVar36 + -0x1160) = 0x119697;
  CUnpacker::Reset((CUnpacker *)(puVar36 + -0x1128),pvVar4,iVar20);
  *(undefined8 *)(puVar36 + -0x1160) = 0x11969f;
  uVar18 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
  if (*(int *)(puVar36 + -0x1110) != 0) goto LAB_001196a6;
  uVar37 = (int)uVar18 >> 1;
  uVar19 = pPacket->m_Flags;
  if ((uVar18 & 1) == 0) {
    if ((uVar19 & 1) != 0) {
      pIVar5 = this->m_pGameClient;
      p_Var6 = (pIVar5->super_IInterface)._vptr_IInterface[0xd];
      *(undefined8 *)(puVar36 + -0x1160) = 0x1196f1;
      (*p_Var6)(pIVar5,(ulong)uVar37,puVar36 + -0x1128);
      if ((this->m_RecordGameMessage == true) && ((this->m_DemoRecorder).m_File != (IOHANDLE)0x0)) {
        pvVar4 = pPacket->m_pData;
        iVar20 = pPacket->m_DataSize;
        *(undefined8 *)(puVar36 + -0x1160) = 0x11971b;
        CDemoRecorder::RecordMessage(&this->m_DemoRecorder,pvVar4,iVar20);
      }
    }
    goto LAB_001196a6;
  }
  if (uVar37 == 2 && (uVar19 & 1) != 0) {
    pCVar1 = (CUnpacker *)(puVar36 + -0x1128);
    *(undefined8 *)(puVar36 + -0x1160) = 6;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119743;
    pcVar24 = CUnpacker::GetString(pCVar1,(int)uVar39);
    *(undefined8 *)(puVar36 + -0x1160) = 0x11974e;
    uVar18 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119758;
    uVar19 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119763;
    iVar20 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar36 + -0x1160) = 0x11976e;
    iVar21 = CUnpacker::GetInt(pCVar1);
    if (*(int *)(puVar36 + -0x1110) == 0) {
      *(int *)(puVar36 + -0x1140) = iVar21;
      *(int *)(puVar36 + -0x1134) = iVar20;
      *(undefined8 *)(puVar36 + -0x1160) = 0x20;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x11978f;
      pSVar25 = (SHA256_DIGEST *)CUnpacker::GetRaw((CUnpacker *)(puVar36 + -0x1128),(int)uVar39);
      pIVar7 = this->m_pMapChecker;
      p_Var6 = (pIVar7->super_IInterface)._vptr_IInterface[3];
      *(undefined8 *)(puVar36 + -0x1160) = 0x1197aa;
      iVar20 = (*p_Var6)(pIVar7,pcVar24,pSVar25,(ulong)uVar18,(ulong)uVar19);
      pcVar38 = (char *)0x0;
      pcVar27 = pcVar24;
      if ((char)iVar20 == '\0') {
        pcVar38 = "invalid standard map";
      }
      do {
        cVar3 = *pcVar27;
        if ((cVar3 == '/') || (cVar3 == '\\')) {
          pcVar38 = "strange character in map name";
        }
        else if (cVar3 == '\0') goto LAB_001199da;
        pcVar27 = pcVar27 + 1;
      } while( true );
    }
    goto LAB_001196a6;
  }
  if (uVar37 != 3 || (uVar19 & 1) == 0) {
    if (uVar37 == 4 && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x11995f;
      memset((CServerInfo *)(puVar36 + 0xeff8),0,0x228c);
      this_00 = (CClient *)&pPacket->m_Address;
      *(undefined8 *)(puVar36 + -0x1160) = 0x30;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 1;
      uVar10 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119979;
      net_addr_str((NETADDR *)this_00,puVar36 + 0xf154,(int)uVar39,(int)uVar10);
      *(undefined8 *)(puVar36 + -0x1160) = 0x11998b;
      iVar20 = UnpackServerInfo(this_00,(CUnpacker *)(puVar36 + -0x1128),
                                (CServerInfo *)(puVar36 + 0xeff8),(int *)0x0);
      if (iVar20 == 0 && *(int *)(puVar36 + -0x1110) == 0) {
        *(undefined8 *)(puVar36 + -0x1160) = 0x1199a5;
        SortClients((CServerInfo *)(puVar36 + 0xeff8));
        *(undefined8 *)(puVar36 + -0x1160) = 0x1199b9;
        mem_copy(&this->m_CurrentServerInfo,(CServerInfo *)(puVar36 + 0xeff8),0x228c);
        *(undefined8 *)((this->m_CurrentServerInfo).m_NetAddr.ip + 0xc) =
             *(undefined8 *)((this->m_ServerAddress).ip + 0xc);
        uVar13 = (this->m_ServerAddress).ip[0];
        uVar14 = (this->m_ServerAddress).ip[1];
        uVar15 = (this->m_ServerAddress).ip[2];
        uVar16 = (this->m_ServerAddress).ip[3];
        uVar39 = *(undefined8 *)((this->m_ServerAddress).ip + 4);
        (this->m_CurrentServerInfo).m_NetAddr.type = (this->m_ServerAddress).type;
        (this->m_CurrentServerInfo).m_NetAddr.ip[0] = uVar13;
        (this->m_CurrentServerInfo).m_NetAddr.ip[1] = uVar14;
        (this->m_CurrentServerInfo).m_NetAddr.ip[2] = uVar15;
        (this->m_CurrentServerInfo).m_NetAddr.ip[3] = uVar16;
        *(undefined8 *)((this->m_CurrentServerInfo).m_NetAddr.ip + 4) = uVar39;
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 5 && (uVar19 & 1) != 0) {
      p_Var6 = (this->m_pGameClient->super_IInterface)._vptr_IInterface[0xc];
      *(undefined8 *)(puVar36 + -0x1160) = 0x119a1a;
      (*p_Var6)();
      goto LAB_001196a6;
    }
    if (uVar37 == 0x1a) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x1b;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 1;
      uVar10 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119be9;
      CMsgPacker::CMsgPacker((CMsgPacker *)(puVar36 + 0xeff8),(int)uVar39,SUB81(uVar10,0));
      p_Var6 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
      *(undefined8 *)(puVar36 + -0x1160) = 0x119bfa;
      (*p_Var6)(this,(CMsgPacker *)(puVar36 + 0xeff8),0);
      goto LAB_001196a6;
    }
    if (uVar37 == 0xe && (uVar19 & 1) != 0) {
      pCVar1 = (CUnpacker *)(puVar36 + -0x1128);
      *(undefined8 *)(puVar36 + -0x1160) = 2;
      iVar20 = (int)*(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119c58;
      pcVar24 = CUnpacker::GetString(pCVar1,iVar20);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119c65;
      pcVar27 = CUnpacker::GetString(pCVar1,iVar20);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119c72;
      pcVar38 = CUnpacker::GetString(pCVar1,iVar20);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
        *(undefined8 *)(puVar36 + -0x1160) = 4;
        uVar39 = *(undefined8 *)(puVar36 + -0x1160);
        p_Var6 = pp_Var29[9];
        *(undefined8 *)(puVar36 + -0x1160) = 0x119c98;
        (*p_Var6)(pIVar40,pcVar24,pcVar38,uVar39,pcVar27);
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 0xf && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 2;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119d27;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),(int)uVar39);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var6 = (pIVar40->super_IInterface)._vptr_IInterface[10];
        *(undefined8 *)(puVar36 + -0x1160) = 0x119d42;
        (*p_Var6)(pIVar40,pcVar24);
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 0x1d && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 2;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119d69;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),(int)uVar39);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var6 = (pIVar40->super_IInterface)._vptr_IInterface[0xc];
        *(undefined8 *)(puVar36 + -0x1160) = 0x119d84;
        (*p_Var6)(pIVar40,pcVar24);
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 0x1e && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 2;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119dab;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),(int)uVar39);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var6 = (pIVar40->super_IInterface)._vptr_IInterface[0xd];
        *(undefined8 *)(puVar36 + -0x1160) = 0x119dc6;
        (*p_Var6)(pIVar40,pcVar24);
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 0xb && (uVar19 & 1) != 0) {
      this->m_RconAuthed = 1;
      this->m_UseTempRconCommands = 1;
      goto LAB_001196a6;
    }
    if (uVar37 == 0xc && (uVar19 & 1) != 0) {
      this->m_RconAuthed = 0;
      if (this->m_UseTempRconCommands != 0) {
        p_Var6 = (this->m_pConsole->super_IInterface)._vptr_IInterface[0xb];
        *(undefined8 *)(puVar36 + -0x1160) = 0x119e22;
        (*p_Var6)();
      }
      this->m_UseTempRconCommands = 0;
      p_Var6 = (this->m_pConsole->super_IInterface)._vptr_IInterface[0xe];
      *(undefined8 *)(puVar36 + -0x1160) = 0x119e36;
      (*p_Var6)();
      goto LAB_001196a6;
    }
    if (uVar37 == 0xd && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 1;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119e5b;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),(int)uVar39);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar5 = this->m_pGameClient;
        p_Var6 = (pIVar5->super_IInterface)._vptr_IInterface[3];
        *(undefined8 *)(puVar36 + -0x1160) = 0x119e73;
        (*p_Var6)(pIVar5,pcVar24);
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 10) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x119f02;
      iVar20 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      *(undefined8 *)(puVar36 + -0x1160) = 0x119f0d;
      iVar21 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      lVar32 = 0;
      do {
        lVar31 = lVar32;
        if (lVar31 + 0x218 == 0x1a4d8) goto LAB_001196a6;
        lVar32 = lVar31 + 0x218;
      } while (*(int *)((long)&this->m_aInputs[0].m_Tick + lVar31) != iVar20);
      lVar32 = *(long *)((long)&this->m_aInputs[0].m_PredictedTime + lVar31);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119f3f;
      iVar30 = time_get();
      lVar31 = *(long *)((long)&this->m_aInputs[0].m_Time + lVar31);
      *(float *)(puVar36 + -0x1140) = (float)(iVar21 + -10) / 1000.0;
      *(undefined8 *)(puVar36 + -0x1160) = 0x119f66;
      iVar33 = time_freq();
      lVar32 = (iVar30 + lVar32) - ((long)((float)iVar33 * *(float *)(puVar36 + -0x1140)) + lVar31);
      if (lVar32 != 0) {
        *(undefined8 *)(puVar36 + -0x1160) = 1;
        uVar39 = *(undefined8 *)(puVar36 + -0x1160);
        *(undefined8 *)(puVar36 + -0x1160) = 0x119fa4;
        CSmoothTime::Update(&this->m_PredictedTime,&this->m_InputtimeMarginGraph,lVar32,iVar21,
                            (int)uVar39);
      }
      goto LAB_001196a6;
    }
    if (uVar37 == 0x1b) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x119e8b;
      iVar30 = time_get();
      *(float *)(puVar36 + -0x1140) = (float)((iVar30 - this->m_PingStartTime) * 1000);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119ea9;
      iVar30 = time_freq();
      pcVar24 = puVar36 + 0xeff8;
      *(undefined8 *)(puVar36 + -0x1160) = 0x119eda;
      str_format(pcVar24,0x100,"latency %.2f",
                 (double)(*(float *)(puVar36 + -0x1140) / (float)iVar30));
      pIVar40 = this->m_pConsole;
      pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
      pcVar27 = "client/network";
      uVar39 = 0;
    }
    else {
      if ((uVar18 & 0xfffffffc) != 0xc && uVar37 != 8) goto LAB_001196a6;
      *(undefined8 *)(puVar36 + -0x1160) = 0x119fcd;
      iVar20 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      *(ulong *)(puVar36 + -0x1140) = CONCAT44(extraout_var_00,iVar20);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119fda;
      iVar20 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      if ((this->super_IClient).m_State < 2) goto LAB_001196a6;
      uVar19 = 0;
      *(undefined8 *)(puVar36 + -0x1160) = 1;
      uVar18 = (uint)*(undefined8 *)(puVar36 + -0x1160);
      if (uVar37 == 7) {
        bVar12 = true;
        uVar37 = 0;
        *(undefined4 *)(puVar36 + -0x1134) = 0;
      }
      else {
        if (uVar37 == 6) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a005;
          uVar18 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a010;
          uVar19 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
        }
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a020;
        iVar21 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
        *(int *)(puVar36 + -0x1134) = iVar21;
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a02c;
        uVar37 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
        bVar12 = false;
      }
      *(undefined8 *)(puVar36 + -0x1160) = 0x11a04e;
      puVar26 = CUnpacker::GetRaw((CUnpacker *)(puVar36 + -0x1128),uVar37);
      if (((((int)uVar19 < 0) || (uVar18 - 0x41 < 0xffffffc0)) || (*(int *)(puVar36 + -0x1110) != 0)
          ) || (900 < uVar37 || uVar18 <= uVar19)) goto LAB_001196a6;
      iVar21 = (int)*(undefined8 *)(puVar36 + -0x1140);
      iVar20 = iVar21 - iVar20;
      if (iVar21 < this->m_CurrentRecvTick) goto LAB_001196a6;
      if (iVar21 != this->m_CurrentRecvTick) {
        this->m_SnapshotParts = 0;
        this->m_CurrentRecvTick = (int)*(undefined8 *)(puVar36 + -0x1140);
      }
      *(undefined8 *)(puVar36 + -0x1160) = 0x11a0d2;
      mem_copy(this->m_aSnapshotIncomingData + uVar19 * 900,puVar26,uVar37);
      uVar22 = this->m_SnapshotParts;
      *(undefined8 *)(puVar36 + -0x1160) = 0xffffffffffffffff;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      uVar22 = uVar22 | 1 << (uVar19 & 0x1f);
      this->m_SnapshotParts = uVar22;
      if (((int)uVar39 << ((byte)uVar18 & 0x1f) ^ uVar22) != 0xffffffff) goto LAB_001196a6;
      *(CSnapshot **)(puVar36 + -0x1130) = &ProcessServerPacket::Emptysnap;
      this->m_SnapshotParts = 0;
      ProcessServerPacket::Emptysnap.m_DataSize = 0;
      ProcessServerPacket::Emptysnap.m_NumItems = 0;
      if (-1 < iVar20) {
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a12e;
        iVar21 = CSnapshotStorage::Get
                           (&this->m_SnapshotStorage,iVar20,(int64 *)0x0,
                            (CSnapshot **)(puVar36 + -0x1130),(CSnapshot **)0x0);
        if (iVar21 < 0) {
          if (this->m_pConfig->m_Debug != 0) {
            *(undefined8 *)(puVar36 + -0x1160) = 0x11a3f0;
            str_format(puVar36 + -0x1108,0x100,"error, couldn\'t find the delta snapshot");
            pIVar40 = this->m_pConsole;
            pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
            *(undefined8 *)(puVar36 + -0x1160) = 2;
            uVar39 = *(undefined8 *)(puVar36 + -0x1160);
            p_Var6 = pp_Var29[0x19];
            *(undefined8 *)(puVar36 + -0x1160) = 0x11a410;
            (*p_Var6)(pIVar40,uVar39,"client",puVar36 + -0x1108,0);
          }
          this->m_AckGameTick = -1;
          goto LAB_001196a6;
        }
      }
      iVar21 = uVar18 * 900 + uVar37 + -900;
      *(undefined8 *)(puVar36 + -0x1160) = 0x11a157;
      pDst_ = CSnapshotDelta::EmptyDelta(&this->m_SnapshotDelta);
      if (iVar21 == 0) {
        *(undefined8 *)(puVar36 + -0x1160) = 0xc;
        iVar23 = (int)*(undefined8 *)(puVar36 + -0x1160);
      }
      else {
        pDst_ = (CData *)(puVar36 + 0xeff8);
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a17b;
        lVar32 = CVariableInt::Decompress(this->m_aSnapshotIncomingData,iVar21,pDst_,0x10000);
        iVar23 = (int)lVar32;
        if (iVar23 < 0) goto LAB_001196a6;
      }
      *(undefined8 *)(puVar36 + -0x1160) = 0x11a1ac;
      uVar18 = CSnapshotDelta::UnpackDelta
                         (&this->m_SnapshotDelta,*(CSnapshot **)(puVar36 + -0x1130),
                          (CSnapshot *)(puVar36 + -0x1008),pDst_,iVar23);
      if (-1 < (int)uVar18) {
        if (!bVar12) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a1c9;
          iVar23 = CSnapshot::Crc((CSnapshot *)(puVar36 + -0x1008));
          if (iVar23 != *(int *)(puVar36 + -0x1134)) {
            if (this->m_pConfig->m_Debug != 0) {
              uVar18 = this->m_SnapCrcErrors;
              *(undefined8 *)(puVar36 + -0x1160) = 0x11a477;
              iVar23 = CSnapshot::Crc((CSnapshot *)(puVar36 + -0x1008));
              *(int *)(puVar36 + -0x1148) = iVar20;
              *(int *)(puVar36 + -0x1150) = iVar21;
              *(int *)(puVar36 + -0x1158) = iVar23;
              *(undefined8 *)(puVar36 + -0x1160) = 0x11a4ab;
              str_format(puVar36 + -0x1108,0x100,
                         "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d"
                         ,(ulong)uVar18,*(undefined8 *)(puVar36 + -0x1140),
                         (ulong)*(uint *)(puVar36 + -0x1134));
              pIVar40 = this->m_pConsole;
              pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
              *(undefined8 *)(puVar36 + -0x1160) = 2;
              uVar39 = *(undefined8 *)(puVar36 + -0x1160);
              p_Var6 = pp_Var29[0x19];
              *(undefined8 *)(puVar36 + -0x1160) = 0x11a4cb;
              (*p_Var6)(pIVar40,uVar39,"client",puVar36 + -0x1108,0);
            }
            iVar20 = this->m_SnapCrcErrors;
            this->m_SnapCrcErrors = iVar20 + 1;
            if (9 < iVar20) {
              this->m_AckGameTick = -1;
              *(undefined8 *)(puVar36 + -0x1160) = 0x11a4f2;
              SendInput(this);
              this->m_SnapCrcErrors = 0;
            }
            goto LAB_001196a6;
          }
        }
        if (this->m_SnapCrcErrors != 0) {
          this->m_SnapCrcErrors = this->m_SnapCrcErrors + -1;
        }
        if ((this->m_aSnapshots[1] != (CHolder *)0x0) &&
           (iVar21 = this->m_aSnapshots[1]->m_Tick, iVar21 < iVar20)) {
          iVar20 = iVar21;
        }
        if ((this->m_aSnapshots[0] != (CHolder *)0x0) &&
           (iVar21 = this->m_aSnapshots[0]->m_Tick, iVar21 < iVar20)) {
          iVar20 = iVar21;
        }
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a223;
        CSnapshotStorage::PurgeUntil(&this->m_SnapshotStorage,iVar20);
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a228;
        iVar30 = time_get();
        *(undefined8 *)(puVar36 + -0x1160) = 1;
        uVar39 = *(undefined8 *)(puVar36 + -0x1160);
        *(undefined8 *)(puVar36 + -0x1160) = 0x11a247;
        CSnapshotStorage::Add
                  (&this->m_SnapshotStorage,(int)*(undefined8 *)(puVar36 + -0x1140),iVar30,uVar18,
                   puVar36 + -0x1008,SUB81(uVar39,0));
        if ((this->m_DemoRecorder).m_File != (IOHANDLE)0x0) {
          pSnapshot = (CSnapshot *)(puVar36 + -0x1008);
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a272;
          CSnapshotBuilder::Init(&this->m_DemoRecSnapshotBuilder,pSnapshot);
          p_Var6 = (this->m_pGameClient->super_IInterface)._vptr_IInterface[6];
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a27c;
          (*p_Var6)();
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a287;
          iVar20 = CSnapshotBuilder::Finish(&this->m_DemoRecSnapshotBuilder,pSnapshot);
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a299;
          CDemoRecorder::RecordSnapshot
                    (&this->m_DemoRecorder,(int)*(undefined8 *)(puVar36 + -0x1140),pSnapshot,iVar20)
          ;
        }
        iVar20 = this->m_ReceivedSnapshots + 1;
        this->m_ReceivedSnapshots = iVar20;
        iVar21 = (int)*(undefined8 *)(puVar36 + -0x1140);
        this->m_CurrentRecvTick = iVar21;
        *(undefined8 *)(puVar36 + -0x1160) = 0x32;
        lVar32 = *(long *)(puVar36 + -0x1160);
        if (iVar20 == 2) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a2ca;
          iVar30 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a2de;
          CSmoothTime::Init(&this->m_PredictedTime,(iVar30 * iVar21) / lVar32);
          (this->m_PredictedTime).m_aAdjustSpeed[1] = 1000.0;
          uVar39 = *(undefined8 *)(puVar36 + -0x1140);
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a2fe;
          iVar30 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a312;
          CSmoothTime::Init(&this->m_GameTime,(iVar30 * ((int)uVar39 + -1)) / lVar32);
          CVar2 = this->m_SnapshotStorage;
          auVar41._0_8_ = CVar2.m_pLast;
          auVar41._8_4_ = (int)CVar2.m_pFirst;
          auVar41._12_4_ = CVar2.m_pFirst._4_4_;
          *(undefined1 (*) [16])this->m_aSnapshots = auVar41;
          *(undefined8 *)(puVar36 + -0x1160) = 3;
          uVar39 = *(undefined8 *)(puVar36 + -0x1160);
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a332;
          SetState(this,(int)uVar39);
          iVar20 = this->m_ReceivedSnapshots;
        }
        if (2 < iVar20) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a349;
          iVar30 = time_get();
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a354;
          iVar30 = CSmoothTime::Get(&this->m_GameTime,iVar30);
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a35c;
          iVar33 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a374;
          iVar34 = time_freq();
          uVar39 = *(undefined8 *)(puVar36 + -0x1140);
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a398;
          iVar35 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x11a3b5;
          CSmoothTime::Update(&this->m_GameTime,&this->m_GametimeMarginGraph,
                              (iVar35 * ((int)uVar39 + -1)) / lVar32,
                              (int)((((iVar33 * iVar21) / lVar32 - iVar30) * 1000) / iVar34),0);
        }
        this->m_AckGameTick = (int)*(undefined8 *)(puVar36 + -0x1140);
        goto LAB_001196a6;
      }
      pcVar24 = puVar36 + -0x1108;
      *(undefined8 *)(puVar36 + -0x1160) = 0x40;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      *(undefined8 *)(puVar36 + -0x1160) = 0x11a438;
      str_format(pcVar24,(int)uVar39,"delta unpack failed! (%d)",(ulong)uVar18);
      pIVar40 = this->m_pConsole;
      pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
      pcVar27 = "client";
      *(undefined8 *)(puVar36 + -0x1160) = 2;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    }
    goto LAB_00119bc0;
  }
  if (this->m_MapdownloadFileTemp == (IOHANDLE)0x0) goto LAB_001196a6;
  uVar18 = this->m_MapdownloadTotalsize - this->m_MapdownloadAmount;
  if (this->m_MapDownloadChunkSize < (int)uVar18) {
    uVar18 = this->m_MapDownloadChunkSize;
  }
  *(undefined8 *)(puVar36 + -0x1160) = 0x11982b;
  puVar26 = CUnpacker::GetRaw((CUnpacker *)(puVar36 + -0x1128),uVar18);
  if (*(int *)(puVar36 + -0x1110) != 0) goto LAB_001196a6;
  pIVar8 = this->m_MapdownloadFileTemp;
  *(undefined8 *)(puVar36 + -0x1160) = 0x119847;
  io_write(pIVar8,puVar26,uVar18);
  iVar20 = this->m_MapdownloadChunk + 1;
  this->m_MapdownloadChunk = iVar20;
  iVar21 = uVar18 + this->m_MapdownloadAmount;
  this->m_MapdownloadAmount = iVar21;
  if (iVar21 != this->m_MapdownloadTotalsize) {
    if (iVar20 % this->m_MapdownloadChunkNum != 0) goto LAB_001196a6;
    *(undefined8 *)(puVar36 + -0x1160) = 0x17;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    *(undefined8 *)(puVar36 + -0x1160) = 1;
    uVar10 = *(undefined8 *)(puVar36 + -0x1160);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119cc2;
    CMsgPacker::CMsgPacker((CMsgPacker *)(puVar36 + 0xeff8),(int)uVar39,SUB81(uVar10,0));
    pp_Var29 = (this->super_IClient).super_IInterface._vptr_IInterface;
    *(undefined8 *)(puVar36 + -0x1160) = 3;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    p_Var6 = pp_Var29[0x24];
    *(undefined8 *)(puVar36 + -0x1160) = 0x119cd4;
    (*p_Var6)(this,(CMsgPacker *)(puVar36 + 0xeff8),uVar39);
    if (this->m_pConfig->m_Debug == 0) goto LAB_001196a6;
    pIVar40 = this->m_pConsole;
    pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
    pcVar24 = "requested next chunk package";
    goto LAB_00119bbd;
  }
  pIVar40 = this->m_pConsole;
  pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
  *(undefined8 *)(puVar36 + -0x1160) = 1;
  uVar39 = *(undefined8 *)(puVar36 + -0x1160);
  p_Var6 = pp_Var29[0x19];
  *(undefined8 *)(puVar36 + -0x1160) = 0x119891;
  (*p_Var6)(pIVar40,uVar39,"client/network","download complete, loading map",0);
  pIVar8 = this->m_MapdownloadFileTemp;
  if (pIVar8 != (IOHANDLE)0x0) {
    *(undefined8 *)(puVar36 + -0x1160) = 0x1198a2;
    io_close(pIVar8);
  }
  this->m_MapdownloadFileTemp = (IOHANDLE)0x0;
  this->m_MapdownloadAmount = 0;
  this->m_MapdownloadTotalsize = -1;
  pIVar9 = this->m_pStorage;
  pcVar24 = this->m_aMapdownloadFilename;
  p_Var6 = (pIVar9->super_IInterface)._vptr_IInterface[9];
  *(undefined8 *)(puVar36 + -0x1160) = 0x1198d7;
  (*p_Var6)(pIVar9,pcVar24,0);
  pIVar9 = this->m_pStorage;
  p_Var6 = (pIVar9->super_IInterface)._vptr_IInterface[10];
  *(undefined8 *)(puVar36 + -0x1160) = 0x1198f0;
  (*p_Var6)(pIVar9,this->m_aMapdownloadFilenameTemp,pcVar24,0);
  pSVar25 = (SHA256_DIGEST *)0x0;
  if (this->m_MapdownloadSha256Present != false) {
    pSVar25 = &this->m_MapdownloadSha256;
  }
  uVar18 = this->m_MapdownloadCrc;
  *(undefined8 *)(puVar36 + -0x1160) = 0x11991e;
  pcVar38 = LoadMap(this,this->m_aMapdownloadName,pcVar24,pSVar25,uVar18);
  if (pcVar38 == (char *)0x0) goto LAB_00119bff;
LAB_001199f0:
  *(undefined8 *)(puVar36 + -0x1160) = 0x1199f5;
  DisconnectWithReason(this,pcVar38);
LAB_001196a6:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar36 + 0x1eff8)) {
    *(undefined8 *)(puVar36 + -0x1160) = 0x11a18d;
    __stack_chk_fail();
  }
  return;
LAB_001199da:
  if ((int)uVar19 < 1) {
    pcVar38 = "invalid map size";
  }
  if (pcVar38 == (char *)0x0) {
    *(undefined8 *)(puVar36 + -0x1160) = 0x119a2f;
    pcVar27 = LoadMapSearch(this,pcVar24,pSVar25,uVar18);
    if (pcVar27 == (char *)0x0) {
LAB_00119bff:
      pIVar40 = this->m_pConsole;
      pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
      *(undefined8 *)(puVar36 + -0x1160) = 1;
      uVar39 = *(undefined8 *)(puVar36 + -0x1160);
      p_Var6 = pp_Var29[0x19];
      *(undefined8 *)(puVar36 + -0x1160) = 0x119c23;
      (*p_Var6)(pIVar40,uVar39,"client/network","loading done",0);
      *(undefined8 *)(puVar36 + -0x1160) = 0x119c2b;
      SendReady(this);
      goto LAB_001196a6;
    }
    pIVar8 = this->m_MapdownloadFileTemp;
    if (pIVar8 != (IOHANDLE)0x0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x119a49;
      io_close(pIVar8);
      pIVar9 = this->m_pStorage;
      p_Var6 = (pIVar9->super_IInterface)._vptr_IInterface[9];
      *(undefined8 *)(puVar36 + -0x1160) = 0x119a5f;
      (*p_Var6)(pIVar9,this->m_aMapdownloadFilenameTemp,0);
    }
    *(undefined8 *)(puVar36 + -0x1160) = 0x119a75;
    FormatMapDownloadFilename(pcVar24,pSVar25,uVar18,false,this->m_aMapdownloadFilename,in_R9D);
    pcVar27 = this->m_aMapdownloadFilenameTemp;
    *(undefined8 *)(puVar36 + -0x1160) = 1;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119a8f;
    FormatMapDownloadFilename(pcVar24,pSVar25,uVar18,SUB81(uVar39,0),pcVar27,in_R9D);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119aad;
    str_format(puVar36 + -0x1008,0x100,"starting to download map to \'%s\'",pcVar27);
    pIVar40 = this->m_pConsole;
    pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
    *(undefined8 *)(puVar36 + -0x1160) = 1;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    p_Var6 = pp_Var29[0x19];
    *(undefined8 *)(puVar36 + -0x1160) = 0x119ad2;
    (*p_Var6)(pIVar40,uVar39,"client/network",puVar36 + -0x1008,0);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119ae6;
    str_copy(this->m_aMapdownloadName,pcVar24,0x200);
    pIVar9 = this->m_pStorage;
    pp_Var29 = (pIVar9->super_IInterface)._vptr_IInterface;
    *(undefined8 *)(puVar36 + -0x1158) = 0;
    *(undefined8 *)(puVar36 + -0x1150) = 0;
    *(undefined8 *)(puVar36 + -0x1160) = 2;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    p_Var6 = pp_Var29[4];
    *(undefined8 *)(puVar36 + -0x1160) = 0x119b08;
    iVar20 = (*p_Var6)(pIVar9,pcVar27,uVar39,0,0,0);
    this->m_MapdownloadFileTemp = (IOHANDLE)CONCAT44(extraout_var,iVar20);
    this->m_MapdownloadChunk = 0;
    this->m_MapdownloadChunkNum = *(int *)(puVar36 + -0x1134);
    this->m_MapDownloadChunkSize = *(int *)(puVar36 + -0x1140);
    pSVar28 = &SHA256_ZEROED;
    if (pSVar25 != (SHA256_DIGEST *)0x0) {
      pSVar28 = pSVar25;
    }
    uVar39 = *(undefined8 *)(pSVar28->data + 8);
    uVar10 = *(undefined8 *)(pSVar28->data + 0x10);
    uVar11 = *(undefined8 *)(pSVar28->data + 0x18);
    *(undefined8 *)(this->m_MapdownloadSha256).data = *(undefined8 *)pSVar28->data;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 8) = uVar39;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 0x10) = uVar10;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 0x18) = uVar11;
    this->m_MapdownloadSha256Present = pSVar25 != (SHA256_DIGEST *)0x0;
    this->m_MapdownloadCrc = uVar18;
    this->m_MapdownloadTotalsize = uVar19;
    this->m_MapdownloadAmount = 0;
    *(undefined8 *)(puVar36 + -0x1160) = 0x17;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    *(undefined8 *)(puVar36 + -0x1160) = 1;
    uVar10 = *(undefined8 *)(puVar36 + -0x1160);
    *(undefined8 *)(puVar36 + -0x1160) = 0x119b7e;
    CMsgPacker::CMsgPacker((CMsgPacker *)(puVar36 + 0xeff8),(int)uVar39,SUB81(uVar10,0));
    pp_Var29 = (this->super_IClient).super_IInterface._vptr_IInterface;
    *(undefined8 *)(puVar36 + -0x1160) = 3;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
    p_Var6 = pp_Var29[0x24];
    *(undefined8 *)(puVar36 + -0x1160) = 0x119b90;
    (*p_Var6)(this,(CMsgPacker *)(puVar36 + 0xeff8),uVar39);
    if (this->m_pConfig->m_Debug == 0) goto LAB_001196a6;
    pIVar40 = this->m_pConsole;
    pp_Var29 = (pIVar40->super_IInterface)._vptr_IInterface;
    pcVar24 = "requested first chunk package";
LAB_00119bbd:
    pcVar27 = "client/network";
    *(undefined8 *)(puVar36 + -0x1160) = 2;
    uVar39 = *(undefined8 *)(puVar36 + -0x1160);
LAB_00119bc0:
    p_Var6 = pp_Var29[0x19];
    *(undefined8 *)(puVar36 + -0x1160) = 0x119bc9;
    (*p_Var6)(pIVar40,uVar39,pcVar27,pcVar24,0);
    goto LAB_001196a6;
  }
  goto LAB_001199f0;
}

Assistant:

void CClient::ProcessServerPacket(CNetChunk *pPacket)
{
	CUnpacker Unpacker;
	Unpacker.Reset(pPacket->m_pData, pPacket->m_DataSize);

	// unpack msgid and system flag
	int Msg = Unpacker.GetInt();
	int Sys = Msg&1;
	Msg >>= 1;

	if(Unpacker.Error())
		return;

	if(Sys)
	{
		// system message
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_CHANGE)
		{
			const char *pMap = Unpacker.GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
			int MapCrc = Unpacker.GetInt();
			int MapSize = Unpacker.GetInt();
			int MapChunkNum = Unpacker.GetInt();
			int MapChunkSize = Unpacker.GetInt();
			if(Unpacker.Error())
				return;
			const SHA256_DIGEST *pMapSha256 = (const SHA256_DIGEST *)Unpacker.GetRaw(sizeof(*pMapSha256));
			const char *pError = 0;

			// check for valid standard map
			if(!m_pMapChecker->IsMapValid(pMap, pMapSha256, MapCrc, MapSize))
				pError = "invalid standard map";

			// protect the player from nasty map names
			for(int i = 0; pMap[i]; i++)
			{
				if(pMap[i] == '/' || pMap[i] == '\\')
					pError = "strange character in map name";
			}

			if(MapSize <= 0)
				pError = "invalid map size";

			if(pError)
				DisconnectWithReason(pError);
			else
			{
				pError = LoadMapSearch(pMap, pMapSha256, MapCrc);

				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
				{
					if(m_MapdownloadFileTemp)
					{
						io_close(m_MapdownloadFileTemp);
						Storage()->RemoveFile(m_aMapdownloadFilenameTemp, IStorage::TYPE_SAVE);
					}

					// start map download
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, false, m_aMapdownloadFilename, sizeof(m_aMapdownloadFilename));
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, true, m_aMapdownloadFilenameTemp, sizeof(m_aMapdownloadFilenameTemp));

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "starting to download map to '%s'", m_aMapdownloadFilenameTemp);
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", aBuf);

					str_copy(m_aMapdownloadName, pMap, sizeof(m_aMapdownloadName));
					m_MapdownloadFileTemp = Storage()->OpenFile(m_aMapdownloadFilenameTemp, IOFLAG_WRITE, IStorage::TYPE_SAVE);
					m_MapdownloadChunk = 0;
					m_MapdownloadChunkNum = MapChunkNum;
					m_MapDownloadChunkSize = MapChunkSize;
					m_MapdownloadSha256 = pMapSha256 ? *pMapSha256 : SHA256_ZEROED;
					m_MapdownloadSha256Present = pMapSha256;
					m_MapdownloadCrc = MapCrc;
					m_MapdownloadTotalsize = MapSize;
					m_MapdownloadAmount = 0;

					// request first chunk package of map data
					CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
					SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

					if(Config()->m_Debug)
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested first chunk package");
				}
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_DATA)
		{
			if(!m_MapdownloadFileTemp)
				return;

			int Size = minimum(m_MapDownloadChunkSize, m_MapdownloadTotalsize-m_MapdownloadAmount);
			const unsigned char *pData = Unpacker.GetRaw(Size);
			if(Unpacker.Error())
				return;

			io_write(m_MapdownloadFileTemp, pData, Size);
			++m_MapdownloadChunk;
			m_MapdownloadAmount += Size;

			if(m_MapdownloadAmount == m_MapdownloadTotalsize)
			{
				// map download complete
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "download complete, loading map");

				if(m_MapdownloadFileTemp)
					io_close(m_MapdownloadFileTemp);
				m_MapdownloadFileTemp = 0;
				m_MapdownloadAmount = 0;
				m_MapdownloadTotalsize = -1;

				Storage()->RemoveFile(m_aMapdownloadFilename, IStorage::TYPE_SAVE);
				Storage()->RenameFile(m_aMapdownloadFilenameTemp, m_aMapdownloadFilename, IStorage::TYPE_SAVE);

				// load map
				const char *pError = LoadMap(m_aMapdownloadName, m_aMapdownloadFilename, m_MapdownloadSha256Present ? &m_MapdownloadSha256 : 0, m_MapdownloadCrc);
				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
					DisconnectWithReason(pError);
			}
			else if(m_MapdownloadChunk%m_MapdownloadChunkNum == 0)
			{
				// request next chunk package of map data
				CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
				SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

				if(Config()->m_Debug)
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested next chunk package");
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_SERVERINFO)
		{
			CServerInfo Info = {0};
			net_addr_str(&pPacket->m_Address, Info.m_aAddress, sizeof(Info.m_aAddress), true);
			if(!UnpackServerInfo(&Unpacker, &Info, 0) && !Unpacker.Error())
			{
				SortClients(&Info);
				mem_copy(&m_CurrentServerInfo, &Info, sizeof(m_CurrentServerInfo));
				m_CurrentServerInfo.m_NetAddr = m_ServerAddress;
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_CON_READY)
		{
			GameClient()->OnConnected();
		}
		else if(Msg == NETMSG_PING)
		{
			CMsgPacker Msg(NETMSG_PING_REPLY, true);
			SendMsg(&Msg, 0);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pHelp = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pParams = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTemp(pName, pParams, CFGFLAG_SERVER, pHelp);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTemp(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_ON)
		{
			m_RconAuthed = 1;
			m_UseTempRconCommands = 1;
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_OFF)
		{
			m_RconAuthed = 0;
			if(m_UseTempRconCommands)
				m_pConsole->DeregisterTempAll();
			m_UseTempRconCommands = 0;
			m_pConsole->DeregisterTempMapAll();
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_LINE)
		{
			const char *pLine = Unpacker.GetString();
			if(Unpacker.Error() == 0)
				GameClient()->OnRconLine(pLine);
		}
		else if(Msg == NETMSG_PING_REPLY)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "latency %.2f", (time_get() - m_PingStartTime)*1000 / (float)time_freq());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/network", aBuf);
		}
		else if(Msg == NETMSG_INPUTTIMING)
		{
			int InputPredTick = Unpacker.GetInt();
			int TimeLeft = Unpacker.GetInt();

			// adjust our prediction time
			int64 Target = 0;
			for(int k = 0; k < 200; k++)
			{
				if(m_aInputs[k].m_Tick == InputPredTick)
				{
					Target = m_aInputs[k].m_PredictedTime + (time_get() - m_aInputs[k].m_Time);
					Target = Target - (int64)(((TimeLeft-PREDICTION_MARGIN)/1000.0f)*time_freq());
					break;
				}
			}

			if(Target)
				m_PredictedTime.Update(&m_InputtimeMarginGraph, Target, TimeLeft, 1);
		}
		else if(Msg == NETMSG_SNAP || Msg == NETMSG_SNAPSINGLE || Msg == NETMSG_SNAPEMPTY)
		{
			int NumParts = 1;
			int Part = 0;
			int GameTick = Unpacker.GetInt();
			int DeltaTick = GameTick-Unpacker.GetInt();
			int PartSize = 0;
			int Crc = 0;
			int CompleteSize = 0;
			const char *pData = 0;

			// we are not allowed to process snapshot yet
			if(State() < IClient::STATE_LOADING)
				return;

			if(Msg == NETMSG_SNAP)
			{
				NumParts = Unpacker.GetInt();
				Part = Unpacker.GetInt();
			}

			if(Msg != NETMSG_SNAPEMPTY)
			{
				Crc = Unpacker.GetInt();
				PartSize = Unpacker.GetInt();
			}

			pData = (const char *)Unpacker.GetRaw(PartSize);

			if(Unpacker.Error() || NumParts < 1 || NumParts > CSnapshot::MAX_PARTS || Part < 0 || Part >= NumParts || PartSize < 0 || PartSize > MAX_SNAPSHOT_PACKSIZE)
				return;

			if(GameTick >= m_CurrentRecvTick)
			{
				if(GameTick != m_CurrentRecvTick)
				{
					m_SnapshotParts = 0;
					m_CurrentRecvTick = GameTick;
				}

				// TODO: clean this up abit
				mem_copy((char*)m_aSnapshotIncomingData + Part*MAX_SNAPSHOT_PACKSIZE, pData, PartSize);
				m_SnapshotParts |= 1<<Part;

				if(m_SnapshotParts == (unsigned)((1<<NumParts)-1))
				{
					static CSnapshot Emptysnap;
					CSnapshot *pDeltaShot = &Emptysnap;
					int PurgeTick;
					int DeltaSize;
					unsigned char aTmpBuffer2[CSnapshot::MAX_SIZE];
					unsigned char aTmpBuffer3[CSnapshot::MAX_SIZE];
					CSnapshot *pTmpBuffer3 = (CSnapshot*)aTmpBuffer3;	// Fix compiler warning for strict-aliasing
					int SnapSize;

					CompleteSize = (NumParts-1) * MAX_SNAPSHOT_PACKSIZE + PartSize;

					// reset snapshoting
					m_SnapshotParts = 0;

					// find snapshot that we should use as delta
					Emptysnap.Clear();

					// find delta
					if(DeltaTick >= 0)
					{
						int DeltashotSize = m_SnapshotStorage.Get(DeltaTick, 0, &pDeltaShot, 0);

						if(DeltashotSize < 0)
						{
							// couldn't find the delta snapshots that the server used
							// to compress this snapshot. force the server to resync
							if(Config()->m_Debug)
							{
								char aBuf[256];
								str_format(aBuf, sizeof(aBuf), "error, couldn't find the delta snapshot");
								m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
							}

							// ack snapshot
							// TODO: combine this with the input message
							m_AckGameTick = -1;
							return;
						}
					}

					// decompress snapshot
					const void *pDeltaData = m_SnapshotDelta.EmptyDelta();
					DeltaSize = sizeof(int)*3;

					if(CompleteSize)
					{
						int IntSize = CVariableInt::Decompress(m_aSnapshotIncomingData, CompleteSize, aTmpBuffer2, sizeof(aTmpBuffer2));

						if(IntSize < 0) // failure during decompression, bail
							return;

						pDeltaData = aTmpBuffer2;
						DeltaSize = IntSize;
					}

					// unpack delta
					SnapSize = m_SnapshotDelta.UnpackDelta(pDeltaShot, pTmpBuffer3, pDeltaData, DeltaSize);
					if(SnapSize < 0)
					{
						char aBuf[64];
						str_format(aBuf, sizeof(aBuf), "delta unpack failed! (%d)", SnapSize);
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						return;
					}

					if(Msg != NETMSG_SNAPEMPTY && pTmpBuffer3->Crc() != Crc)
					{
						if(Config()->m_Debug)
						{
							char aBuf[256];
							str_format(aBuf, sizeof(aBuf), "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d",
								m_SnapCrcErrors, GameTick, Crc, pTmpBuffer3->Crc(), CompleteSize, DeltaTick);
							m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						}

						m_SnapCrcErrors++;
						if(m_SnapCrcErrors > 10)
						{
							// to many errors, send reset
							m_AckGameTick = -1;
							SendInput();
							m_SnapCrcErrors = 0;
						}
						return;
					}
					else
					{
						if(m_SnapCrcErrors)
							m_SnapCrcErrors--;
					}

					// purge old snapshots
					PurgeTick = DeltaTick;
					if(m_aSnapshots[SNAP_PREV] && m_aSnapshots[SNAP_PREV]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_PREV]->m_Tick;
					if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_CURRENT]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_CURRENT]->m_Tick;
					m_SnapshotStorage.PurgeUntil(PurgeTick);

					// add new
					m_SnapshotStorage.Add(GameTick, time_get(), SnapSize, pTmpBuffer3, 1);

					// add snapshot to demo
					if(m_DemoRecorder.IsRecording())
					{
						// build up snapshot and add local messages
						m_DemoRecSnapshotBuilder.Init(pTmpBuffer3);
						GameClient()->OnDemoRecSnap();
						SnapSize = m_DemoRecSnapshotBuilder.Finish(pTmpBuffer3);

						// write snapshot
						m_DemoRecorder.RecordSnapshot(GameTick, pTmpBuffer3, SnapSize);
					}

					// apply snapshot, cycle pointers
					m_ReceivedSnapshots++;

					m_CurrentRecvTick = GameTick;

					// we got two snapshots until we see us self as connected
					if(m_ReceivedSnapshots == 2)
					{
						// start at 200ms and work from there
						m_PredictedTime.Init(GameTick*time_freq()/50);
						m_PredictedTime.SetAdjustSpeed(1, 1000.0f);
						m_GameTime.Init((GameTick-1)*time_freq()/50);
						m_aSnapshots[SNAP_PREV] = m_SnapshotStorage.m_pFirst;
						m_aSnapshots[SNAP_CURRENT] = m_SnapshotStorage.m_pLast;
						SetState(IClient::STATE_ONLINE);
					}

					// adjust game time
					if(m_ReceivedSnapshots > 2)
					{
						int64 Now = m_GameTime.Get(time_get());
						int64 TickStart = GameTick*time_freq()/50;
						int64 TimeLeft = (TickStart-Now)*1000 / time_freq();
						m_GameTime.Update(&m_GametimeMarginGraph, (GameTick-1)*time_freq()/50, TimeLeft, 0);
					}

					// ack snapshot
					m_AckGameTick = GameTick;
				}
			}
		}
	}
	else
	{
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0)
		{
			// game message
			GameClient()->OnMessage(Msg, &Unpacker);

			if(m_RecordGameMessage && m_DemoRecorder.IsRecording())
				m_DemoRecorder.RecordMessage(pPacket->m_pData, pPacket->m_DataSize);
		}
	}
}